

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O1

void __thiscall
dg::vr::StructureAnalyzer::setValidAreasFromSinglePredecessor
          (StructureAnalyzer *this,VRLocation *location,
          vector<bool,_std::allocator<bool>_> *validAreas)

{
  VREdge *pVVar1;
  __uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> _Var2;
  
  pVVar1 = *(location->predecessors).
            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::vector<bool,_std::allocator<bool>_>::operator=
            (validAreas,&(pVVar1->source->relations).validAreas);
  _Var2._M_t.super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>.
  super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl =
       (pVVar1->op)._M_t.super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>.
       _M_t;
  if (*(VROpType *)
       ((long)_Var2._M_t.super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>.
              super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl + 8) == INSTRUCTION) {
    setValidAreasByInstruction
              (this,location,validAreas,
               (VRInstruction *)
               _Var2._M_t.super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>
               .super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl);
  }
  _Var2._M_t.super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>.
  super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl =
       (pVVar1->op)._M_t.super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>.
       _M_t;
  if (*(VROpType *)
       ((long)_Var2._M_t.super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>.
              super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl + 8) == ASSUME_BOOL) {
    setValidAreasByAssumeBool
              (this,location,validAreas,
               (VRAssumeBool *)
               _Var2._M_t.super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>
               .super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl);
    return;
  }
  return;
}

Assistant:

void StructureAnalyzer::setValidAreasFromSinglePredecessor(
        VRLocation &location, std::vector<bool> &validAreas) const {
    // copy predecessors valid areas
    VREdge *edge = location.getPredEdge(0);
    validAreas = edge->source->relations.getValidAreas();

    // and alter them according to info from edge
    if (edge->op->isInstruction())
        setValidAreasByInstruction(
                location, validAreas,
                static_cast<VRInstruction *>(edge->op.get()));

    if (edge->op->isAssumeBool())
        setValidAreasByAssumeBool(location, validAreas,
                                  static_cast<VRAssumeBool *>(edge->op.get()));
}